

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::lts_20250127::Mutex::Fer(Mutex *this,PerThreadSynch *w)

{
  long lVar1;
  uint uVar2;
  PerThreadSynch *pPVar3;
  SynchEvent *pSVar4;
  int mode;
  int extraout_EDX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  Mutex *unaff_RBX;
  SynchWaitParams *waitp;
  PerThreadSynch *head;
  char *pcVar5;
  synchronization_internal *this_00;
  ulong mu;
  bool bVar6;
  
  waitp = w->waitp;
  head = (PerThreadSynch *)this;
  if (waitp->cond == (Condition *)0x0) {
    if (waitp->cv_word == (atomic<long> *)0x0) {
      (waitp->timeout).rep_ = 0xffffffffffffffff;
      mu = (this->mu_).super___atomic_base<long>._M_i;
      if (((waitp->how != (MuHow)kSharedS | 8) & (uint)mu) != 0) {
        this_00 = (synchronization_internal *)0x0;
        do {
          mode = (int)in_RDX;
          if ((mu & 0x44) == 0) {
            head = (PerThreadSynch *)0x0;
            pPVar3 = Enqueue((PerThreadSynch *)0x0,waitp,mu,6);
            if (pPVar3 == (PerThreadSynch *)0x0) {
              Fer();
              unaff_RBX = this;
              goto LAB_00330325;
            }
            LOCK();
            bVar6 = mu == (this->mu_).super___atomic_base<long>._M_i;
            if (bVar6) {
              (this->mu_).super___atomic_base<long>._M_i =
                   (ulong)((uint)mu & 0xbb) | (ulong)pPVar3 | 4;
            }
            UNLOCK();
            mode = extraout_EDX;
            if (bVar6) {
              return;
            }
          }
          else if ((mu & 0x40) == 0) {
            LOCK();
            bVar6 = mu == (this->mu_).super___atomic_base<long>._M_i;
            if (bVar6) {
              (this->mu_).super___atomic_base<long>._M_i = mu | 0x44;
            }
            UNLOCK();
            if (bVar6) {
              head = (PerThreadSynch *)(mu & 0xffffffffffffff00);
              pPVar3 = Enqueue(head,w->waitp,mu,6);
              if (pPVar3 != (PerThreadSynch *)0x0) {
                do {
                  lVar1 = (this->mu_).super___atomic_base<long>._M_i;
                  LOCK();
                  bVar6 = lVar1 == (this->mu_).super___atomic_base<long>._M_i;
                  if (bVar6) {
                    (this->mu_).super___atomic_base<long>._M_i =
                         (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar3 | 4;
                  }
                  UNLOCK();
                } while (!bVar6);
                return;
              }
              goto LAB_0033032f;
            }
          }
          uVar2 = synchronization_internal::MutexDelay(this_00,1,mode);
          mu = (this->mu_).super___atomic_base<long>._M_i;
          waitp = w->waitp;
          this_00 = (synchronization_internal *)(ulong)uVar2;
          in_RDX = extraout_RDX;
        } while (((waitp->how != (MuHow)kSharedS | 8) & (uint)mu) != 0);
      }
      w->next = (PerThreadSynch *)0x0;
      (w->state)._M_i = kAvailable;
      AbslInternalPerThreadSemPost_lts_20250127((ThreadIdentity *)w);
      return;
    }
  }
  else {
LAB_00330325:
    Fer();
  }
  this = unaff_RBX;
  Fer();
LAB_0033032f:
  Fer();
  if (((((atomic<long> *)&head->next)->super___atomic_base<long>)._M_i & 8U) != 0) {
    return;
  }
  pSVar4 = GetSynchEvent(head);
  pcVar5 = "";
  if (pSVar4 != (SynchEvent *)0x0) {
    pcVar5 = pSVar4->name;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x9c4,"thread should hold write lock on Mutex %p %s",head,pcVar5,this
            );
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x9c4,"void absl::Mutex::AssertHeld() const");
}

Assistant:

void Mutex::Fer(PerThreadSynch* w) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  ABSL_RAW_CHECK(w->waitp->cond == nullptr,
                 "Mutex::Fer while waiting on Condition");
  ABSL_RAW_CHECK(w->waitp->cv_word == nullptr,
                 "Mutex::Fer with pending CondVar queueing");
  // The CondVar timeout is not relevant for the Mutex wait.
  w->waitp->timeout = {};
  for (;;) {
    intptr_t v = mu_.load(std::memory_order_relaxed);
    // Note: must not queue if the mutex is unlocked (nobody will wake it).
    // For example, we can have only kMuWait (conditional) or maybe
    // kMuWait|kMuWrWait.
    // conflicting != 0 implies that the waking thread cannot currently take
    // the mutex, which in turn implies that someone else has it and can wake
    // us if we queue.
    const intptr_t conflicting =
        kMuWriter | (w->waitp->how == kShared ? 0 : kMuReader);
    if ((v & conflicting) == 0) {
      w->next = nullptr;
      w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
      IncrementSynchSem(this, w);
      return;
    } else {
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h =
            Enqueue(nullptr, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | (v & kMuLow) | kMuWait,
                std::memory_order_release, std::memory_order_relaxed)) {
          return;
        }
      } else if ((v & kMuSpin) == 0 &&
                 mu_.compare_exchange_strong(v, v | kMuSpin | kMuWait)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        do {
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & kMuLow & ~kMuSpin) | kMuWait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
}